

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O0

void icu_63::ucnv_enumDependencies
               (UDataSwapper *ds,char *itemName,UDataInfo *pInfo,uint8_t *inBytes,int32_t length,
               CheckDependency *check,void *context,UErrorCode *pErrorCode)

{
  uint32_t uVar1;
  uint uVar2;
  byte *pbVar3;
  size_t sVar4;
  char *inBaseName;
  char local_88 [4];
  int32_t baseNameLength;
  char baseName [32];
  int32_t extOffset;
  uint32_t mbcsHeaderOptions;
  uint32_t mbcsHeaderFlags;
  uint32_t mbcsHeaderLength;
  uint8_t outputType;
  _MBCSHeader *inMBCSHeader;
  UConverterStaticData *inStaticData;
  uint32_t staticDataSize;
  CheckDependency *check_local;
  int32_t length_local;
  uint8_t *inBytes_local;
  UDataInfo *pInfo_local;
  char *itemName_local;
  UDataSwapper *ds_local;
  
  if ((pInfo->formatVersion[0] != '\x06') || (pInfo->formatVersion[1] < 2)) {
    fprintf(_stderr,"icupkg/ucnv_enumDependencies(): .cnv format version %02x.%02x not supported\n",
            (ulong)pInfo->formatVersion[0],(ulong)pInfo->formatVersion[1]);
    exit(0x10);
  }
  if ((length < 100) || (uVar1 = (*ds->readUInt32)(*(uint32_t *)inBytes), (uint)length < uVar1)) {
    udata_printError_63(ds,
                        "icupkg/ucnv_enumDependencies(): too few bytes (%d after header) for an ICU .cnv conversion table\n"
                        ,(ulong)(uint)length);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    pbVar3 = inBytes + uVar1;
    uVar2 = length - uVar1;
    if (inBytes[0x45] == '\x02') {
      if ((int)uVar2 < 0x28) {
        udata_printError_63(ds,
                            "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n"
                            ,(ulong)uVar2);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      else {
        if ((*pbVar3 == 4) && (pbVar3[1] != 0)) {
          mbcsHeaderOptions = 8;
        }
        else {
          if ((*pbVar3 != 5) ||
             ((pbVar3[1] < 3 ||
              (uVar1 = (*ds->readUInt32)(*(uint32_t *)(pbVar3 + 0x20)), (uVar1 & 0xff80) != 0)))) {
            udata_printError_63(ds,
                                "icupkg/ucnv_enumDependencies(): unsupported _MBCSHeader.version %d.%d\n"
                                ,(ulong)*pbVar3,(ulong)pbVar3[1]);
            *pErrorCode = U_UNSUPPORTED_ERROR;
            return;
          }
          mbcsHeaderOptions = uVar1 & 0x3f;
        }
        uVar1 = (*ds->readUInt32)(*(uint32_t *)(pbVar3 + 0x18));
        baseName._28_4_ = uVar1 >> 8;
        if ((char)uVar1 == '\x0e') {
          if ((int)uVar2 < (int)(baseName._28_4_ + 0x80)) {
            udata_printError_63(ds,
                                "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n"
                                ,(ulong)uVar2);
            *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          }
          else {
            sVar4 = strlen((char *)(pbVar3 + (mbcsHeaderOptions << 2)));
            if ((int)sVar4 < 0x20) {
              (*ds->swapInvChars)(ds,pbVar3 + (mbcsHeaderOptions << 2),(int)sVar4 + 1,local_88,
                                  pErrorCode);
              checkIDSuffix(itemName,local_88,-1,".cnv",check,context,pErrorCode);
            }
            else {
              udata_printError_63(ds,
                                  "icupkg/ucnv_enumDependencies(%s): base name length %ld too long\n"
                                  ,itemName,sVar4 & 0xffffffff);
              *pErrorCode = U_UNSUPPORTED_ERROR;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
ucnv_enumDependencies(const UDataSwapper *ds,
                      const char *itemName, const UDataInfo *pInfo,
                      const uint8_t *inBytes, int32_t length,
                      CheckDependency check, void *context,
                      UErrorCode *pErrorCode) {
    uint32_t staticDataSize;

    const UConverterStaticData *inStaticData;

    const _MBCSHeader *inMBCSHeader;
    uint8_t outputType;

    /* check format version */
    if(!(
        pInfo->formatVersion[0]==6 &&
        pInfo->formatVersion[1]>=2
    )) {
        fprintf(stderr, "icupkg/ucnv_enumDependencies(): .cnv format version %02x.%02x not supported\n",
                        pInfo->formatVersion[0], pInfo->formatVersion[1]);
        exit(U_UNSUPPORTED_ERROR);
    }

    /* read the initial UConverterStaticData structure after the UDataInfo header */
    inStaticData=(const UConverterStaticData *)inBytes;

    if( length<(int32_t)sizeof(UConverterStaticData) ||
        (uint32_t)length<(staticDataSize=ds->readUInt32(inStaticData->structSize))
    ) {
        udata_printError(ds, "icupkg/ucnv_enumDependencies(): too few bytes (%d after header) for an ICU .cnv conversion table\n",
                            length);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }

    inBytes+=staticDataSize;
    length-=(int32_t)staticDataSize;

    /* check for supported conversionType values */
    if(inStaticData->conversionType==UCNV_MBCS) {
        /* MBCS data */
        uint32_t mbcsHeaderLength, mbcsHeaderFlags, mbcsHeaderOptions;
        int32_t extOffset;

        inMBCSHeader=(const _MBCSHeader *)inBytes;

        if(length<(int32_t)sizeof(_MBCSHeader)) {
            udata_printError(ds, "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n",
                                length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return;
        }
        if(inMBCSHeader->version[0]==4 && inMBCSHeader->version[1]>=1) {
            mbcsHeaderLength=MBCS_HEADER_V4_LENGTH;
        } else if(inMBCSHeader->version[0]==5 && inMBCSHeader->version[1]>=3 &&
                  ((mbcsHeaderOptions=ds->readUInt32(inMBCSHeader->options))&
                   MBCS_OPT_UNKNOWN_INCOMPATIBLE_MASK)==0
        ) {
            mbcsHeaderLength=mbcsHeaderOptions&MBCS_OPT_LENGTH_MASK;
        } else {
            udata_printError(ds, "icupkg/ucnv_enumDependencies(): unsupported _MBCSHeader.version %d.%d\n",
                             inMBCSHeader->version[0], inMBCSHeader->version[1]);
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return;
        }

        mbcsHeaderFlags=ds->readUInt32(inMBCSHeader->flags);
        extOffset=(int32_t)(mbcsHeaderFlags>>8);
        outputType=(uint8_t)mbcsHeaderFlags;

        if(outputType==MBCS_OUTPUT_EXT_ONLY) {
            /*
             * extension-only file,
             * contains a base name instead of normal base table data
             */
            char baseName[32];
            int32_t baseNameLength;

            /* there is extension data after the base data, see ucnv_ext.h */
            if(length<(extOffset+UCNV_EXT_INDEXES_MIN_LENGTH*4)) {
                udata_printError(ds, "icupkg/ucnv_enumDependencies(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n",
                                 length);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return;
            }

            /* swap the base name, between the header and the extension data */
            const char *inBaseName=(const char *)inBytes+mbcsHeaderLength*4;
            baseNameLength=(int32_t)strlen(inBaseName);
            if(baseNameLength>=(int32_t)sizeof(baseName)) {
                udata_printError(ds, "icupkg/ucnv_enumDependencies(%s): base name length %ld too long\n",
                                 itemName, baseNameLength);
                *pErrorCode=U_UNSUPPORTED_ERROR;
                return;
            }
            ds->swapInvChars(ds, inBaseName, baseNameLength+1, baseName, pErrorCode);

            checkIDSuffix(itemName, baseName, -1, ".cnv", check, context, pErrorCode);
        }
    }
}